

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O0

int __thiscall OpenMD::ifstrstream::open(ifstrstream *this,char *__file,int __oflag,...)

{
  bool bVar1;
  undefined1 in_CL;
  bool in_stack_ffffffffffffffdb;
  openmode in_stack_ffffffffffffffdc;
  undefined3 in_stack_ffffffffffffffe8;
  
  if ((this->isRead & 1U) == 0) {
    bVar1 = internalOpen((ifstrstream *)
                         (CONCAT44(__oflag,CONCAT13(in_CL,in_stack_ffffffffffffffe8)) &
                         0xffffffff01ffffff),(char *)this,in_stack_ffffffffffffffdc,
                         in_stack_ffffffffffffffdb);
    this->isRead = bVar1;
  }
  return (int)this;
}

Assistant:

void ifstrstream::open(const char* filename, std::ios_base::openmode mode,
                         bool checkFilename) {
    if (!isRead) {
#if defined(_MSC_VER)
      isRead =
          internalOpen(filename, mode | std::ios_base::binary, checkFilename);
#else
      isRead = internalOpen(filename, mode, checkFilename);
#endif
    }
  }